

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O2

bool ritobin::io::json_impl::hash_from_json<ritobin::FNV1a>(FNV1a *value,json *json)

{
  bool bVar1;
  uint uVar2;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if ((byte)(json->m_type - number_integer) < 3) {
    uVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get<unsigned_int,_unsigned_int,_0>(json);
    bVar1 = true;
    if (value->hash_ != uVar2) {
      value->hash_ = uVar2;
      (value->str_)._M_string_length = 0;
      *(value->str_)._M_dataplus._M_p = '\0';
    }
  }
  else if (json->m_type == string) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_50,json);
    std::__cxx11::string::string((string *)&local_30,&local_50);
    FNV1a::operator=(value,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool hash_from_json(T& value, json const& json) noexcept {
        using hash_t = std::remove_cvref_t<decltype(value.hash())>;
        if (json.is_number()) {
            hash_t hash = json;
            value = hash;
            return true;
        } else if (json.is_string()){
            std::string str = json;
            value = str;
            return true;
        } else {
            return false;
        }
    }